

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion_exception.cpp
# Opt level: O2

void __thiscall
duckdb::ConversionException::ConversionException
          (ConversionException *this,PhysicalType orig_type,PhysicalType new_type)

{
  PhysicalType type;
  undefined7 in_register_00000031;
  string sStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  TypeIdToString_abi_cxx11_(&local_38,(duckdb *)CONCAT71(in_register_00000031,orig_type),new_type);
  ::std::operator+(&local_98,"Type ",&local_38);
  ::std::operator+(&local_78,&local_98," can\'t be cast as ");
  TypeIdToString_abi_cxx11_(&sStack_b8,(duckdb *)(ulong)new_type,type);
  ::std::operator+(&local_58,&local_78,&sStack_b8);
  Exception::Exception(&this->super_Exception,CONVERSION,&local_58);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&sStack_b8);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)&this->super_Exception = &PTR__runtime_error_0177b100;
  return;
}

Assistant:

ConversionException::ConversionException(const PhysicalType orig_type, const PhysicalType new_type)
    : Exception(ExceptionType::CONVERSION,
                "Type " + TypeIdToString(orig_type) + " can't be cast as " + TypeIdToString(new_type)) {
}